

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printConnections(PrinterStream *this)

{
  pointer ppVar1;
  Connection *pCVar2;
  CodePrinter *pCVar3;
  char *s;
  pointer ppVar4;
  
  ppVar1 = (this->module->connections).
           super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->module->connections).
                super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    pCVar2 = ppVar4->object;
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,"connection ");
    s = getInterpolationDescription(pCVar2->interpolationType);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,s);
    choc::text::CodePrinter::operator<<(pCVar3,' ');
    printEndpointReference(this,&pCVar2->source);
    if ((pCVar2->delayLength).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      pCVar3 = choc::text::CodePrinter::operator<<(this->out," -> [");
      pCVar3 = choc::text::CodePrinter::operator<<
                         (pCVar3,(pCVar2->delayLength).super__Optional_base<long,_true,_true>.
                                 _M_payload.super__Optional_payload_base<long>._M_payload._M_value);
      choc::text::CodePrinter::operator<<(pCVar3,']');
    }
    choc::text::CodePrinter::operator<<(this->out," -> ");
    printEndpointReference(this,&pCVar2->dest);
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,';');
    choc::text::CodePrinter::startNewLine(pCVar3);
  }
  return;
}

Assistant:

void printConnections()
        {
            for (auto c : module.connections)
            {
                out << "connection "
                    << getInterpolationDescription (c->interpolationType)
                    << ' ';

                printEndpointReference (c->source);

                if (c->delayLength)
                    out << " -> [" << *c->delayLength << ']';

                out << " -> ";
                printEndpointReference (c->dest);
                out << ';' << newLine;
            }
        }